

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

void Sbd_ManCutExpand(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vCut)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  uint Entry;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar1 = vCut->nSize;
  while( true ) {
    uVar8 = (ulong)uVar1;
    uVar9 = 0;
    if (0 < (int)uVar1) break;
LAB_0054cb2a:
    uVar1 = vCut->nSize;
    if ((int)uVar1 <= (int)uVar9) {
      return;
    }
  }
  piVar6 = vCut->pArray;
  uVar14 = 0;
LAB_0054c9e7:
  iVar2 = piVar6[uVar14];
  lVar10 = (long)iVar2;
  if ((lVar10 < 0) || (uVar3 = vLutLevs->nSize, (int)uVar3 <= iVar2)) {
LAB_0054cb9b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (p->nObjs <= iVar2) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar13 = (uint)*(undefined8 *)(p->pObjs + lVar10);
  if ((~uVar13 & 0x9fffffff) == 0) goto LAB_0054cb14;
  if (((int)uVar13 < 0) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                  ,0xb2,
                  "int Sbd_ManCutExpandOne(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                 );
  }
  uVar13 = iVar2 - (uVar13 & 0x1fffffff);
  if (((((int)uVar13 < 0) || (vMirrors->nSize <= (int)uVar13)) ||
      (uVar11 = iVar2 - ((uint)((ulong)*(undefined8 *)(p->pObjs + lVar10) >> 0x20) & 0x1fffffff),
      (int)uVar11 < 0)) || ((uint)vMirrors->nSize <= uVar11)) goto LAB_0054cb9b;
  piVar7 = vLutLevs->pArray;
  uVar4 = vMirrors->pArray[uVar13];
  uVar5 = vMirrors->pArray[uVar11];
  Entry = uVar4 >> 1;
  if ((int)uVar4 < 0) {
    Entry = uVar13;
  }
  lVar12 = 0;
  do {
    uVar13 = piVar6[lVar12];
    if (uVar13 == Entry) break;
    bVar15 = uVar8 - 1 != lVar12;
    lVar12 = lVar12 + 1;
  } while (bVar15);
  uVar4 = uVar5 >> 1;
  if ((int)uVar5 < 0) {
    uVar4 = uVar11;
  }
  uVar9 = 0;
  do {
    uVar11 = piVar6[uVar9];
    if (uVar11 == uVar4) goto LAB_0054cae2;
    uVar9 = uVar9 + 1;
  } while (uVar8 != uVar9);
  if (uVar13 != Entry) goto LAB_0054cb14;
LAB_0054cae2:
  if (((int)Entry < 0) || ((int)uVar3 <= (int)Entry)) goto LAB_0054cb9b;
  if (piVar7[lVar10] < piVar7[Entry]) goto LAB_0054cb14;
  if (((int)uVar4 < 0) || (uVar3 <= uVar4)) goto LAB_0054cb9b;
  if (piVar7[lVar10] < piVar7[uVar4]) goto LAB_0054cb14;
  vCut->nSize = uVar1 - 1;
  uVar9 = uVar14;
  if ((uint)uVar14 < uVar1 - 1) {
    do {
      piVar6[uVar9] = piVar6[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < vCut->nSize);
  }
  if ((Entry != 0) && (uVar13 != Entry)) {
    Vec_IntPushOrder(vCut,Entry);
  }
  uVar9 = uVar14;
  if ((uVar4 != 0) && (uVar11 != uVar4)) {
    Vec_IntPushOrder(vCut,uVar4);
  }
  goto LAB_0054cb2a;
LAB_0054cb14:
  uVar14 = uVar14 + 1;
  uVar9 = uVar8;
  if (uVar14 == uVar8) goto LAB_0054cb2a;
  goto LAB_0054c9e7;
}

Assistant:

void Sbd_ManCutExpand( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    int i, Entry;
    do
    {
        Vec_IntForEachEntry( vCut, Entry, i )
            if ( Sbd_ManCutExpandOne( p, vMirrors, vLutLevs, vCut, i, Entry ) )
                break;
    } 
    while ( i < Vec_IntSize(vCut) );
}